

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_trace.cpp
# Opt level: O3

bool Trace(DVector3 *start,sector_t *sector,DVector3 *direction,double maxDist,ActorFlags *actorMask
          ,DWORD wallMask,AActor *ignore,FTraceResults *res,DWORD flags,
          _func_ETraceStatus_FTraceResults_ptr_void_ptr *callback,void *callbackdata)

{
  double dVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  double y;
  double *pdVar5;
  double dVar6;
  bool bVar7;
  ulong uVar8;
  subsector_t *psVar9;
  int iVar10;
  double local_698;
  undefined8 uStack_690;
  undefined4 local_678;
  undefined4 uStack_674;
  undefined4 uStack_670;
  undefined4 uStack_66c;
  FTraceInfo local_668;
  FTraceResults local_100;
  
  memset(&local_100,0,0xd0);
  local_100.Distance = 3.4028234663852886e+38;
  local_100.Fraction = 3.4028234663852886e+38;
  dVar1 = start->Z;
  local_668.Start.X._0_4_ = *(undefined4 *)&start->X;
  local_668.Start.X._4_4_ = *(undefined4 *)((long)&start->X + 4);
  dVar6 = start->X;
  local_698 = start->X;
  pdVar5 = &start->Y;
  local_668.Start.Y._0_4_ = *(undefined4 *)pdVar5;
  local_668.Start.Y._4_4_ = *(undefined4 *)((long)&start->Y + 4);
  dVar3 = *pdVar5;
  y = *pdVar5;
  local_668.Start.Z = dVar1;
  if ((sector->planes[1].Flags & 0x1d0U) == 0x100) {
    uVar8 = (ulong)sector->Portals[1];
    dVar2 = sectorPortals.Array[uVar8].mPlaneZ;
    if (dVar2 < dVar1) {
      do {
        local_698 = sectorPortals.Array[uVar8].mDisplacement.X + local_698;
        y = sectorPortals.Array[uVar8].mDisplacement.Y + dVar3;
        psVar9 = P_PointInSubsector(local_698,y);
        sector = psVar9->sector;
        if ((sector->planes[1].Flags & 0x1d0U) != 0x100) goto LAB_005788b0;
        uVar8 = (ulong)sector->Portals[1];
        dVar3 = y;
      } while (sectorPortals.Array[uVar8].mPlaneZ <= dVar1 &&
               dVar1 != sectorPortals.Array[uVar8].mPlaneZ);
      dVar6 = local_698;
      if (dVar2 < dVar1) goto LAB_005788b0;
    }
  }
  uVar4 = sector->planes[0].Flags;
  local_668.Start.Y = y;
  local_698 = dVar6;
  local_668.Start.X = dVar6;
  while (((uVar4 & 0x1d0) == 0x100 && (dVar1 <= sectorPortals.Array[sector->Portals[0]].mPlaneZ))) {
    local_698 = local_698 + sectorPortals.Array[sector->Portals[0]].mDisplacement.X;
    y = y + sectorPortals.Array[sector->Portals[0]].mDisplacement.Y;
    psVar9 = P_PointInSubsector(local_698,y);
    sector = psVar9->sector;
    uVar4 = sector->planes[0].Flags;
  }
LAB_005788b0:
  uStack_690._0_4_ = SUB84(y,0);
  uStack_690._4_4_ = (int)((ulong)y >> 0x20);
  local_668.ActorMask = (ActorFlags)actorMask->Value;
  iVar10 = 7;
  if (local_668.ActorMask.Value == 0) {
    iVar10 = 1;
  }
  dVar3 = direction->Z;
  dVar6 = direction->X;
  dVar2 = direction->Y;
  local_668.EnterDist = 0.0;
  local_668.TraceCallback = callback;
  local_668.Results = res;
  local_668.inshootthrough = 1;
  local_668.sectorsel = 0;
  local_668.startfrac = 0.0;
  local_668.Vec.X = dVar6;
  local_668.Vec.Y = dVar2;
  local_668.Vec.Z = dVar3;
  local_668.WallMask = wallMask;
  local_668.IgnoreThis = ignore;
  local_668.CurSector = sector;
  local_668.MaxDist = maxDist;
  local_668.TraceCallbackData = callbackdata;
  local_668.TraceFlags = flags;
  local_668.limitz = dVar1;
  local_668.ptflags = iVar10;
  local_668.Start.Y = y;
  local_668.Start.X = local_698;
  memset(res,0,0xd0);
  if (callback == (_func_ETraceStatus_FTraceResults_ptr_void_ptr *)0x0 || (flags & 0x10) == 0) {
    bVar7 = FTraceInfo::TraceTraverse(&local_668,iVar10);
  }
  else {
    local_100.HitType = TRACE_CrossingPortal;
    local_100.SrcFromTarget.Y = uStack_690;
    local_100.HitPos.Y = uStack_690;
    local_678 = SUB84(dVar6,0);
    uStack_674 = (undefined4)((ulong)dVar6 >> 0x20);
    uStack_670 = SUB84(dVar2,0);
    uStack_66c = (undefined4)((ulong)dVar2 >> 0x20);
    local_100.HitVector.X._0_4_ = local_678;
    local_100.HitVector.X._4_4_ = uStack_674;
    local_100.HitVector.Y._0_4_ = uStack_670;
    local_100.HitVector.Y._4_4_ = uStack_66c;
    local_100.HitPos.X = local_698;
    local_100.HitPos.Z = dVar1;
    local_100.HitVector.Z = dVar3;
    local_100.SrcFromTarget.X = local_698;
    local_100.SrcFromTarget.Z = dVar1;
    (*callback)(&local_100,callbackdata);
    bVar7 = FTraceInfo::TraceTraverse(&local_668,local_668.ptflags);
    local_100.HitType = TRACE_CrossingPortal;
    local_100.HitPos.Z = ((local_668.Results)->HitPos).Z;
    local_100.HitPos.X = ((local_668.Results)->HitPos).X;
    local_100.HitPos.Y = ((local_668.Results)->HitPos).Y;
    local_100.HitVector.Z = local_668.Vec.Z;
    local_100.HitVector.X._0_4_ = local_668.Vec.X._0_4_;
    local_100.HitVector.X._4_4_ = local_668.Vec.X._4_4_;
    local_100.HitVector.Y._0_4_ = local_668.Vec.Y._0_4_;
    local_100.HitVector.Y._4_4_ = local_668.Vec.Y._4_4_;
    local_100.SrcFromTarget.X = local_100.HitPos.X;
    local_100.SrcFromTarget.Y = local_100.HitPos.Y;
    local_100.SrcFromTarget.Z = local_100.HitPos.Z;
    (*callback)(&local_100,local_668.TraceCallbackData);
  }
  if (bVar7) {
    if ((flags & 1) == 0) {
      return true;
    }
    if (res->HitType - TRACE_HitFloor < 2) {
      if ((res->HitTexture).texnum != skyflatnum.texnum) {
        return true;
      }
    }
    else {
      if (res->HitType != TRACE_HitWall) {
        return true;
      }
      if (res->Tier != '\x01') {
        return true;
      }
      iVar10 = res->Line->frontsector->planes[1].Texture.texnum;
      if (iVar10 != skyflatnum.texnum) {
        return true;
      }
      if (res->Line->backsector->planes[1].Texture.texnum != iVar10) {
        return true;
      }
    }
    res->HitType = TRACE_HitNone;
  }
  return false;
}

Assistant:

bool Trace(const DVector3 &start, sector_t *sector, const DVector3 &direction, double maxDist,
	ActorFlags actorMask, DWORD wallMask, AActor *ignore, FTraceResults &res, DWORD flags,
	ETraceStatus(*callback)(FTraceResults &res, void *), void *callbackdata)
{
	FTraceInfo inf;
	FTraceResults tempResult;

	memset(&tempResult, 0, sizeof(tempResult));
	tempResult.Fraction = tempResult.Distance = NO_VALUE;

	inf.Start = start;
	GetPortalTransition(inf.Start, sector);
	inf.ptflags = actorMask ? PT_ADDLINES|PT_ADDTHINGS|PT_COMPATIBLE : PT_ADDLINES;
	inf.Vec = direction;
	inf.ActorMask = actorMask;
	inf.WallMask = wallMask;
	inf.IgnoreThis = ignore;
	inf.CurSector = sector;
	inf.MaxDist = maxDist;
	inf.EnterDist = 0;
	inf.TraceCallback = callback;
	inf.TraceCallbackData = callbackdata;
	inf.TraceFlags = flags;
	inf.Results = &res;
	inf.inshootthrough = true;
	inf.sectorsel=0;
	inf.startfrac = 0;
	inf.limitz = inf.Start.Z;
	memset(&res, 0, sizeof(res));

	if ((flags & TRACE_ReportPortals) && callback != NULL)
	{
		tempResult.HitType = TRACE_CrossingPortal;
		tempResult.HitPos = tempResult.SrcFromTarget = inf.Start;
		tempResult.HitVector = inf.Vec;
		callback(tempResult, inf.TraceCallbackData);
	}
	bool reslt = inf.TraceTraverse(inf.ptflags);

	if ((flags & TRACE_ReportPortals) && callback != NULL)
	{
		tempResult.HitType = TRACE_CrossingPortal;
		tempResult.HitPos = tempResult.SrcFromTarget = inf.Results->HitPos;
		tempResult.HitVector = inf.Vec;
		callback(tempResult, inf.TraceCallbackData);
	}

	if (reslt)
	{ 
		return flags ? EditTraceResult(flags, res) : true;
	}
	else
	{
		return false;
	}
}